

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O0

HighsInt __thiscall HighsMipAnalysis::mipTimerNumCall(HighsMipAnalysis *this,HighsInt mip_clock)

{
  int in_ESI;
  HighsTimer *in_RDI;
  HighsInt highs_timer_clock;
  HighsInt in_stack_ffffffffffffffdc;
  HighsInt local_4;
  
  if (((ulong)(in_RDI->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start & 1) == 0) {
    local_4 = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)&in_RDI->clock_start,(long)in_ESI);
    local_4 = HighsTimer::numCall(in_RDI,in_stack_ffffffffffffffdc);
  }
  return local_4;
}

Assistant:

HighsInt HighsMipAnalysis::mipTimerNumCall(const HighsInt mip_clock
                                           // , const HighsInt thread_id
) const {
  if (!analyse_mip_time) return 0;
  HighsInt highs_timer_clock = mip_clocks.clock_[mip_clock];
  return mip_clocks.timer_pointer_->numCall(highs_timer_clock);
}